

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_quic_transport_params_parse_clienthello_impl
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents,bool used_legacy_codepoint)

{
  SSL *ssl_00;
  SSL3_STATE *pSVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  Span<const_unsigned_char> in;
  SSL *ssl;
  bool used_legacy_codepoint_local;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if (contents == (CBS *)0x0) {
    iVar4 = SSL_is_quic(ssl_00);
    if (iVar4 == 0) {
      bVar2 = Array<unsigned_char>::empty(&hs->config->quic_transport_params);
      if (bVar2) {
        hs_local._7_1_ = true;
      }
      else {
        ERR_put_error(0x10,0,0x131,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xb17);
        *out_alert = 'P';
        hs_local._7_1_ = false;
      }
    }
    else if (used_legacy_codepoint ==
             (bool)((byte)((ushort)*(undefined2 *)&hs->config->field_0x10d >> 9) & 1)) {
      *out_alert = 'm';
      hs_local._7_1_ = false;
    }
    else {
      hs_local._7_1_ = true;
    }
  }
  else {
    iVar4 = SSL_is_quic(ssl_00);
    if (iVar4 == 0) {
      if (used_legacy_codepoint) {
        hs_local._7_1_ = true;
      }
      else {
        *out_alert = 'n';
        hs_local._7_1_ = false;
      }
    }
    else {
      uVar3 = ssl_protocol_version(ssl_00);
      if (uVar3 != 0x304) {
        __assert_fail("ssl_protocol_version(ssl) == TLS1_3_VERSION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xb2d,
                      "bool bssl::ext_quic_transport_params_parse_clienthello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                     );
      }
      if (used_legacy_codepoint ==
          (bool)((byte)((ushort)*(undefined2 *)&hs->config->field_0x10d >> 9) & 1)) {
        pSVar1 = ssl_00->s3;
        in = cbs_st::operator_cast_to_Span(contents);
        hs_local._7_1_ = Array<unsigned_char>::CopyFrom(&pSVar1->peer_quic_transport_params,in);
      }
      else {
        hs_local._7_1_ = true;
      }
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_quic_transport_params_parse_clienthello_impl(
    SSL_HANDSHAKE *hs, uint8_t *out_alert, CBS *contents,
    bool used_legacy_codepoint) {
  SSL *const ssl = hs->ssl;
  if (!contents) {
    if (!SSL_is_quic(ssl)) {
      if (hs->config->quic_transport_params.empty()) {
        return true;
      }
      // QUIC transport parameters must not be set if |ssl| is not configured
      // for QUIC.
      OPENSSL_PUT_ERROR(SSL, SSL_R_QUIC_TRANSPORT_PARAMETERS_MISCONFIGURED);
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
    if (used_legacy_codepoint != hs->config->quic_use_legacy_codepoint) {
      // Silently ignore because we expect the other QUIC codepoint.
      return true;
    }
    *out_alert = SSL_AD_MISSING_EXTENSION;
    return false;
  }
  if (!SSL_is_quic(ssl)) {
    if (used_legacy_codepoint) {
      // Ignore the legacy private-use codepoint because that could be sent
      // to mean something else than QUIC transport parameters.
      return true;
    }
    // Fail if we received the codepoint registered with IANA for QUIC
    // because that is not allowed outside of QUIC.
    *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
    return false;
  }
  assert(ssl_protocol_version(ssl) == TLS1_3_VERSION);
  if (used_legacy_codepoint != hs->config->quic_use_legacy_codepoint) {
    // Silently ignore because we expect the other QUIC codepoint.
    return true;
  }
  return ssl->s3->peer_quic_transport_params.CopyFrom(*contents);
}